

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

void Llb_ManFlowUpdateCut(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  
  Aig_ManIncrementTravId(p);
  if (0 < vMinCut->nSize) {
    lVar7 = 0;
    do {
      Llb_ManFlowLabelTfi_rec(p,(Aig_Obj_t *)vMinCut->pArray[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vMinCut->nSize);
  }
  vMinCut->nSize = 0;
  Aig_ManIncrementTravId(p);
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    lVar7 = 0;
    do {
      pvVar5 = pVVar3->pArray[lVar7];
      if ((pvVar5 != (void *)0x0) &&
         ((uVar2 = (uint)*(undefined8 *)((long)pvVar5 + 0x18), (uVar2 & 7) == 3 ||
          (0xfffffffd < (uVar2 & 7) - 7)))) {
        iVar1 = p->nTravIds;
        if ((*(int *)((long)pvVar5 + 0x20) != iVar1) &&
           (iVar1 + -1 != *(int *)((long)pvVar5 + 0x20))) {
          pvVar6 = (void *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe);
          if (iVar1 + -1 == *(int *)((long)pvVar6 + 0x20)) {
            *(int *)((long)pvVar6 + 0x20) = iVar1;
            uVar2 = vMinCut->nSize;
            if (uVar2 == vMinCut->nCap) {
              if ((int)uVar2 < 0x10) {
                if (vMinCut->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(vMinCut->pArray,0x80);
                }
                vMinCut->pArray = ppvVar4;
                vMinCut->nCap = 0x10;
              }
              else {
                if (vMinCut->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(vMinCut->pArray,(ulong)uVar2 << 4);
                }
                vMinCut->pArray = ppvVar4;
                vMinCut->nCap = uVar2 * 2;
              }
            }
            else {
              ppvVar4 = vMinCut->pArray;
            }
            iVar1 = vMinCut->nSize;
            vMinCut->nSize = iVar1 + 1;
            ppvVar4[iVar1] = pvVar6;
            uVar2 = (uint)*(undefined8 *)((long)pvVar5 + 0x18);
          }
          if (0xfffffffd < (uVar2 & 7) - 7) {
            pvVar5 = (void *)(*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe);
            if (p->nTravIds + -1 == *(int *)((long)pvVar5 + 0x20)) {
              *(int *)((long)pvVar5 + 0x20) = p->nTravIds;
              uVar2 = vMinCut->nSize;
              if (uVar2 == vMinCut->nCap) {
                if ((int)uVar2 < 0x10) {
                  if (vMinCut->pArray == (void **)0x0) {
                    ppvVar4 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar4 = (void **)realloc(vMinCut->pArray,0x80);
                  }
                  vMinCut->pArray = ppvVar4;
                  vMinCut->nCap = 0x10;
                }
                else {
                  if (vMinCut->pArray == (void **)0x0) {
                    ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
                  }
                  else {
                    ppvVar4 = (void **)realloc(vMinCut->pArray,(ulong)uVar2 << 4);
                  }
                  vMinCut->pArray = ppvVar4;
                  vMinCut->nCap = uVar2 * 2;
                }
              }
              else {
                ppvVar4 = vMinCut->pArray;
              }
              iVar1 = vMinCut->nSize;
              vMinCut->nSize = iVar1 + 1;
              ppvVar4[iVar1] = pvVar5;
            }
          }
        }
      }
      lVar7 = lVar7 + 1;
      pVVar3 = p->vObjs;
    } while (lVar7 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Llb_ManFlowUpdateCut( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pObj;
    int i;
    // label the TFI of the cut nodes
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
        Llb_ManFlowLabelTfi_rec( p, pObj );
    // collect labeled fanins of non-labeled nodes
    Vec_PtrClear( vMinCut );
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsCo(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p, pObj) || Aig_ObjIsTravIdPrevious(p, pObj) )
            continue;
        if ( Aig_ObjIsTravIdPrevious(p, Aig_ObjFanin0(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, Aig_ObjFanin0(pObj));
            Vec_PtrPush( vMinCut, Aig_ObjFanin0(pObj) );
        }
        if ( Aig_ObjIsNode(pObj) && Aig_ObjIsTravIdPrevious(p, Aig_ObjFanin1(pObj)) )
        {
            Aig_ObjSetTravIdCurrent(p, Aig_ObjFanin1(pObj));
            Vec_PtrPush( vMinCut, Aig_ObjFanin1(pObj) );
        }
    }
}